

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntSortCompare1(int *pp1,int *pp2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*pp2 <= *pp1) {
    uVar1 = (uint)(*pp2 < *pp1);
  }
  return uVar1;
}

Assistant:

static int Vec_IntSortCompare1( int * pp1, int * pp2 )
{
    // for some reason commenting out lines (as shown) led to crashing of the release version
    if ( *pp1 < *pp2 )
        return -1;
    if ( *pp1 > *pp2 ) //
        return 1;
    return 0; //
}